

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_trc.c
# Opt level: O3

CURLcode Curl_trc_opt(char *config)

{
  undefined8 *puVar1;
  int iVar2;
  CURLcode CVar3;
  char *__s;
  char *first;
  long lVar4;
  int lvl;
  char *tok_buf;
  char *local_38;
  
  if (config == (char *)0x0) {
    return CURLE_OK;
  }
  __s = (*Curl_cstrdup)(config);
  if (__s == (char *)0x0) {
    CVar3 = CURLE_OUT_OF_MEMORY;
  }
  else {
    first = strtok_r(__s,", ",&local_38);
    while (first != (char *)0x0) {
      if (*first == '+') {
        first = first + 1;
LAB_001218b2:
        lvl = 1;
      }
      else {
        if (*first != '-') goto LAB_001218b2;
        first = first + 1;
        lvl = 0;
      }
      iVar2 = curl_strequal(first,"all");
      if (iVar2 == 0) {
        iVar2 = curl_strequal(first,"protocol");
        if (iVar2 == 0) {
          iVar2 = curl_strequal(first,"network");
          if (iVar2 == 0) {
            iVar2 = curl_strequal(first,"proxy");
            if (iVar2 == 0) {
              lVar4 = 0;
              do {
                puVar1 = *(undefined8 **)((long)&trc_cfts[0].cft + lVar4);
                iVar2 = curl_strequal(first,(char *)*puVar1);
                if (iVar2 != 0) {
                  *(int *)((long)puVar1 + 0xc) = lvl;
                  break;
                }
                lVar4 = lVar4 + 0x10;
              } while (lVar4 != 0xd0);
              lVar4 = 0;
              do {
                puVar1 = *(undefined8 **)((long)&trc_feats[0].feat + lVar4);
                iVar2 = curl_strequal(first,(char *)*puVar1);
                if (iVar2 != 0) {
                  *(int *)(puVar1 + 1) = lvl;
                  break;
                }
                lVar4 = lVar4 + 0x10;
              } while (lVar4 != 0x60);
              goto LAB_00121947;
            }
            iVar2 = 4;
          }
          else {
            iVar2 = 2;
          }
        }
        else {
          iVar2 = 1;
        }
        trc_apply_level_by_category(iVar2,lvl);
      }
      else {
        lVar4 = 0;
        do {
          *(int *)(*(long *)((long)&trc_cfts[0].cft + lVar4) + 0xc) = lvl;
          lVar4 = lVar4 + 0x10;
        } while (lVar4 != 0xd0);
        lVar4 = 0;
        do {
          *(int *)(*(long *)((long)&trc_feats[0].feat + lVar4) + 8) = lvl;
          lVar4 = lVar4 + 0x10;
        } while (lVar4 != 0x60);
      }
LAB_00121947:
      first = strtok_r((char *)0x0,", ",&local_38);
    }
    (*Curl_cfree)(__s);
    CVar3 = CURLE_OK;
  }
  return CVar3;
}

Assistant:

CURLcode Curl_trc_opt(const char *config)
{
  CURLcode result = config ? trc_opt(config) : CURLE_OK;
#ifdef DEBUGBUILD
  /* CURL_DEBUG can override anything */
  if(!result) {
    const char *dbg_config = getenv("CURL_DEBUG");
    if(dbg_config)
      result = trc_opt(dbg_config);
  }
#endif /* DEBUGBUILD */
  return result;
}